

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall cmCTest::Initialize(cmCTest *this,char *binary_dir,cmCTestStartCommand *command)

{
  iterator *piVar1;
  pointer *ppuVar2;
  char *pcVar3;
  long lVar4;
  size_t __n;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  ostream *poVar10;
  Status SVar11;
  tm *ptVar12;
  ulong uVar13;
  bool suppress;
  char cVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var16;
  int iVar17;
  int mon;
  undefined4 uStack_1e2c;
  size_type local_1e28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e20;
  string testingDir;
  string tag;
  string tagfile;
  int day;
  time_t tctime;
  int min;
  int hour;
  string group;
  byte abStack_1d70 [80];
  ios_base local_1d20 [136];
  ios_base local_1c98 [264];
  string model;
  ios_base local_1b20 [264];
  int year;
  size_type local_1a10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a08 [6];
  ifstream tfin;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_19a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1998;
  byte abStack_1988 [80];
  ios_base local_1938 [416];
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  
  if (command == (cmCTestStartCommand *)0x0) {
    suppress = false;
  }
  else {
    suppress = command->Quiet;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cm,"Here: ",6);
  plVar9 = (long *)std::ostream::operator<<(&cm,0x1a4);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x1a4,(char *)mf.FindPackageRootPathStack.
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,suppress);
  piVar1 = &mf.FindPackageRootPathStack.
            super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start;
  if ((iterator *)
      mf.FindPackageRootPathStack.
      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map != piVar1) {
    operator_delete(mf.FindPackageRootPathStack.
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (ulong)((long)&((mf.FindPackageRootPathStack.
                                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
  paVar15 = &cm.GeneratorInstance.field_2;
  std::ios_base::~ios_base((ios_base *)paVar15->_M_local_buf);
  if (((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->InteractiveDebugMode == false
     ) {
    BlockTestErrorDiagnostics((cmCTest *)&paVar15->_M_allocated_capacity);
  }
  else {
    ppuVar2 = &cm.Generators.
               super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    cm.Generators.
    super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&cm,"CTEST_INTERACTIVE_DEBUG_MODE=1","");
    cmsys::SystemTools::PutEnv((string *)&cm);
    if (cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppuVar2) {
      operator_delete(cm.Generators.
                      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((cm.Generators.
                                       super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                     .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                     _M_head_impl + 1));
    }
  }
  _Var16._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  pcVar3 = *(char **)((long)&(_Var16._M_head_impl)->BinaryDir + 8);
  strlen(binary_dir);
  std::__cxx11::string::_M_replace
            ((ulong)&(_Var16._M_head_impl)->BinaryDir,0,pcVar3,(ulong)binary_dir);
  cmsys::SystemTools::ConvertToUnixSlashes
            (&((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->BinaryDir);
  UpdateCTestConfiguration(this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cm,"Here: ",6);
  plVar9 = (long *)std::ostream::operator<<(&cm,0x1b0);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x1b0,(char *)mf.FindPackageRootPathStack.
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,suppress);
  if ((iterator *)
      mf.FindPackageRootPathStack.
      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map != piVar1) {
    operator_delete(mf.FindPackageRootPathStack.
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (ulong)((long)&((mf.FindPackageRootPathStack.
                                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
  std::ios_base::~ios_base((ios_base *)cm.GeneratorInstance.field_2._M_local_buf);
  if (((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cm,"Here: ",6);
    plVar9 = (long *)std::ostream::operator<<(&cm,0x1b2);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1b2,(char *)mf.FindPackageRootPathStack.
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map,suppress);
    if ((iterator *)
        mf.FindPackageRootPathStack.
        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map != piVar1) {
      operator_delete(mf.FindPackageRootPathStack.
                      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map,
                      (ulong)((long)&((mf.FindPackageRootPathStack.
                                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
    std::ios_base::~ios_base((ios_base *)cm.GeneratorInstance.field_2._M_local_buf);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cm,"   Site: ",9);
    gg._vptr_cmGlobalGenerator = (_func_int **)&gg.MakeSilentFlag;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gg,"Site","");
    GetCTestConfiguration((string *)&mf,this,(string *)&gg);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&cm,
                         (char *)mf.FindPackageRootPathStack.
                                 super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_map,
                         mf.FindPackageRootPathStack.
                         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_map_size);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    poVar10 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"   Build name: ",0xf);
    model._M_dataplus._M_p = (pointer)&model.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&model,"BuildName","");
    GetCTestConfiguration(&group,this,&model);
    SafeBuildIdField((string *)&tfin,&group);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,_tfin,(long)pcStack_19a0);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_tfin != &local_1998) {
      operator_delete(_tfin,local_1998._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)group._M_dataplus._M_p != &group.field_2) {
      operator_delete(group._M_dataplus._M_p,
                      CONCAT71(group.field_2._M_allocated_capacity._1_7_,
                               group.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)model._M_dataplus._M_p != &model.field_2) {
      operator_delete(model._M_dataplus._M_p,
                      CONCAT71(model.field_2._M_allocated_capacity._1_7_,
                               model.field_2._M_local_buf[0]) + 1);
    }
    if ((iterator *)
        mf.FindPackageRootPathStack.
        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map != piVar1) {
      operator_delete(mf.FindPackageRootPathStack.
                      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map,
                      (ulong)((long)&((mf.FindPackageRootPathStack.
                                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    if ((string *)gg._vptr_cmGlobalGenerator != &gg.MakeSilentFlag) {
      operator_delete(gg._vptr_cmGlobalGenerator,(ulong)(gg.MakeSilentFlag._M_dataplus._M_p + 1));
    }
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1ba,(char *)mf.FindPackageRootPathStack.
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map,suppress);
    if ((iterator *)
        mf.FindPackageRootPathStack.
        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map != piVar1) {
      operator_delete(mf.FindPackageRootPathStack.
                      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map,
                      (ulong)((long)&((mf.FindPackageRootPathStack.
                                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
    std::ios_base::~ios_base((ios_base *)cm.GeneratorInstance.field_2._M_local_buf);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cm,"Produce XML is on",0x11);
    std::ios::widen((char)&cm +
                    (char)cm.Generators.
                          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-3]._M_t.
                          super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                          .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl);
    std::ostream::put((char)&cm);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1bb,(char *)mf.FindPackageRootPathStack.
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map,suppress);
    if ((iterator *)
        mf.FindPackageRootPathStack.
        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map != piVar1) {
      operator_delete(mf.FindPackageRootPathStack.
                      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map,
                      (ulong)((long)&((mf.FindPackageRootPathStack.
                                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
    std::ios_base::~ios_base((ios_base *)cm.GeneratorInstance.field_2._M_local_buf);
    if (((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestModel == 1) {
      mf.FindPackageRootPathStack.
      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = &piVar1->_M_cur;
      std::__cxx11::string::_M_construct<char_const*>((string *)&mf,"NightlyStartTime","");
      GetCTestConfiguration((string *)&cm,this,(string *)&mf);
      if (cm.Generators.
          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&cm.Generators.
                    super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(cm.Generators.
                        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((cm.Generators.
                                         super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                       super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                       .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                       _M_head_impl + 1));
      }
      if ((iterator *)
          mf.FindPackageRootPathStack.
          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map != piVar1) {
        operator_delete(mf.FindPackageRootPathStack.
                        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_map,
                        (ulong)((long)&((mf.FindPackageRootPathStack.
                                         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if (cm.Generators.
          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&cm,
                   "WARNING: No nightly start time found please set in CTestConfig.cmake or DartConfig.cmake"
                   ,0x58);
        std::ios::widen((char)&cm +
                        (char)cm.Generators.
                              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-3]._M_t.
                              super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                              .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl
                       );
        std::ostream::put((char)&cm);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x1c3,(char *)mf.FindPackageRootPathStack.
                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_map,suppress);
        if ((iterator *)
            mf.FindPackageRootPathStack.
            super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map != piVar1) {
          operator_delete(mf.FindPackageRootPathStack.
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_map,
                          (ulong)((long)&((mf.FindPackageRootPathStack.
                                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
        std::ios_base::~ios_base((ios_base *)cm.GeneratorInstance.field_2._M_local_buf);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cm,"Here: ",6);
        plVar9 = (long *)std::ostream::operator<<(&cm,0x1c4);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x1c5,(char *)mf.FindPackageRootPathStack.
                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_map,suppress);
        if ((iterator *)
            mf.FindPackageRootPathStack.
            super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map != piVar1) {
          operator_delete(mf.FindPackageRootPathStack.
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_map,
                          (ulong)((long)&((mf.FindPackageRootPathStack.
                                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
        std::ios_base::~ios_base((ios_base *)cm.GeneratorInstance.field_2._M_local_buf);
        return 0;
      }
    }
  }
  cmake::cmake(&cm,RoleScript,CTest,Normal);
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mf,"");
  cmake::SetHomeDirectory(&cm,(string *)&mf);
  if ((iterator *)
      mf.FindPackageRootPathStack.
      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map != piVar1) {
    operator_delete(mf.FindPackageRootPathStack.
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (ulong)((long)&((mf.FindPackageRootPathStack.
                                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mf,"");
  cmake::SetHomeOutputDirectory(&cm,(string *)&mf);
  if ((iterator *)
      mf.FindPackageRootPathStack.
      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map != piVar1) {
    operator_delete(mf.FindPackageRootPathStack.
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (ulong)((long)&((mf.FindPackageRootPathStack.
                                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)cm.CurrentSnapshot.Position.Position;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cm.CurrentSnapshot.State;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = (size_t)cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mf);
  cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
  local_1998._M_allocated_capacity = cm.CurrentSnapshot.Position.Position;
  _tfin = (pointer)cm.CurrentSnapshot.State;
  cmMakefile::cmMakefile(&mf,&gg,(cmStateSnapshot *)&tfin);
  ReadCustomConfigurationFileTree
            (this,&((this->Impl)._M_t.
                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->BinaryDir,&mf);
  _Var16._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  iVar17 = 1;
  if ((_Var16._M_head_impl)->ProduceXML != true) goto LAB_005265ce;
  lVar4 = *(long *)&((_Var16._M_head_impl)->BinaryDir)._M_dataplus;
  testingDir._M_dataplus._M_p = (pointer)&testingDir.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&testingDir,lVar4,
             *(size_type *)((long)&(_Var16._M_head_impl)->BinaryDir + 8) + lVar4);
  std::__cxx11::string::append((char *)&testingDir);
  bVar6 = cmsys::SystemTools::FileExists(&testingDir);
  if (bVar6) {
    bVar6 = cmsys::SystemTools::FileIsDirectory(&testingDir);
    if (!bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tfin);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&tfin,"File ",5);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&tfin,testingDir._M_dataplus._M_p,testingDir._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," is in the place of the testing directory",0x29);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x1e0,group._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)group._M_dataplus._M_p != &group.field_2) {
        operator_delete(group._M_dataplus._M_p,
                        CONCAT71(group.field_2._M_allocated_capacity._1_7_,
                                 group.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_00526593;
    }
LAB_0052660a:
    if (command == (cmCTestStartCommand *)0x0) {
      cVar14 = '\x01';
    }
    else {
      cVar14 = command->CreateNewTag;
    }
    tagfile._M_dataplus._M_p = (pointer)&tagfile.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tagfile,testingDir._M_dataplus._M_p,
               testingDir._M_dataplus._M_p + testingDir._M_string_length);
    std::__cxx11::string::append((char *)&tagfile);
    std::ifstream::ifstream(&tfin,tagfile._M_dataplus._M_p,_S_in);
    tag._M_dataplus._M_p = (pointer)&tag.field_2;
    tag._M_string_length = 0;
    tag.field_2._M_local_buf[0] = '\0';
    if (cVar14 != '\0') {
      tctime = time((time_t *)0x0);
      if (((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TomorrowTag == true) {
        tctime = tctime + 0x15180;
      }
      ptVar12 = gmtime(&tctime);
      if (((abStack_1988[*(long *)(_tfin + -0x18)] & 5) == 0) &&
         (bVar6 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&tfin,&tag,(bool *)0x0,0xffffffffffffffff), bVar6)) {
        _year = _year & 0xffffffff00000000;
        mon = 0;
        hour = 0;
        min = 0;
        __isoc99_sscanf(tag._M_dataplus._M_p,"%04d%02d%02d-%02d%02d",&year);
        if ((year != ptVar12->tm_year + 0x76c) ||
           ((mon != ptVar12->tm_mon + 1 || (ptVar12->tm_mday != 0)))) {
          tag._M_string_length = 0;
          *tag._M_dataplus._M_p = '\0';
        }
        group._M_string_length = 0;
        group.field_2._M_local_buf[0] = '\0';
        group._M_dataplus._M_p = (pointer)&group.field_2;
        bVar6 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&tfin,&group,(bool *)0x0,0xffffffffffffffff);
        if (((bVar6) && (command == (cmCTestStartCommand *)0x0)) &&
           (_Var16._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
           *(bool *)((long)(_Var16._M_head_impl)->Parts + 0x18) == false)) {
          std::__cxx11::string::_M_assign((string *)&(_Var16._M_head_impl)->SpecificGroup);
        }
        model._M_string_length = 0;
        model.field_2._M_local_buf[0] = '\0';
        model._M_dataplus._M_p = (pointer)&model.field_2;
        bVar6 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&tfin,&model,(bool *)0x0,0xffffffffffffffff);
        if (((bVar6) && (command == (cmCTestStartCommand *)0x0)) &&
           (*(bool *)((long)((this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts
                     + 0x18) == false)) {
          iVar7 = GetTestModelFromString(&model);
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestModel = iVar7;
        }
        std::ifstream::close();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)model._M_dataplus._M_p != &model.field_2) {
          operator_delete(model._M_dataplus._M_p,
                          CONCAT71(model.field_2._M_allocated_capacity._1_7_,
                                   model.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)group._M_dataplus._M_p != &group.field_2) {
          operator_delete(group._M_dataplus._M_p,
                          CONCAT71(group.field_2._M_allocated_capacity._1_7_,
                                   group.field_2._M_local_buf[0]) + 1);
        }
      }
      if (((command != (cmCTestStartCommand *)0x0) || (tag._M_string_length == 0)) ||
         (*(bool *)((long)((this->Impl)._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts +
                   0x18) == true)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&group,"TestModel: ",0xb);
        GetTestModelString_abi_cxx11_(&model,this);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&group,model._M_dataplus._M_p,model._M_string_length);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        paVar15 = &model.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)model._M_dataplus._M_p != paVar15) {
          operator_delete(model._M_dataplus._M_p,
                          CONCAT71(model.field_2._M_allocated_capacity._1_7_,
                                   model.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x218,model._M_dataplus._M_p,suppress);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)model._M_dataplus._M_p != paVar15) {
          operator_delete(model._M_dataplus._M_p,
                          CONCAT71(model.field_2._M_allocated_capacity._1_7_,
                                   model.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
        std::ios_base::~ios_base(local_1d20);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&group,"TestModel: ",0xb);
        plVar9 = (long *)std::ostream::operator<<
                                   (&group,((this->Impl)._M_t.
                                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                            .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                           _M_head_impl)->TestModel);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x21b,model._M_dataplus._M_p,suppress);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)model._M_dataplus._M_p != paVar15) {
          operator_delete(model._M_dataplus._M_p,
                          CONCAT71(model.field_2._M_allocated_capacity._1_7_,
                                   model.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
        std::ios_base::~ios_base(local_1d20);
        if (((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestModel == 1) {
          model._M_dataplus._M_p = (pointer)paVar15;
          std::__cxx11::string::_M_construct<char_const*>((string *)&model,"NightlyStartTime","");
          GetCTestConfiguration(&group,this,&model);
          ptVar12 = (tm *)GetNightlyTime(this,&group,
                                         ((this->Impl)._M_t.
                                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                          .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                         _M_head_impl)->TomorrowTag);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)group._M_dataplus._M_p != &group.field_2) {
            operator_delete(group._M_dataplus._M_p,
                            CONCAT71(group.field_2._M_allocated_capacity._1_7_,
                                     group.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)model._M_dataplus._M_p != paVar15) {
            operator_delete(model._M_dataplus._M_p,
                            CONCAT71(model.field_2._M_allocated_capacity._1_7_,
                                     model.field_2._M_local_buf[0]) + 1);
          }
        }
        snprintf((char *)&year,100,"%04d%02d%02d-%02d%02d",(ulong)(ptVar12->tm_year + 0x76c),
                 (ulong)(ptVar12->tm_mon + 1),(ulong)(uint)ptVar12->tm_mday,
                 (ulong)(uint)ptVar12->tm_hour,(ulong)(uint)ptVar12->tm_min);
        sVar5 = tag._M_string_length;
        strlen((char *)&year);
        std::__cxx11::string::_M_replace((ulong)&tag,0,(char *)sVar5,(ulong)&year);
        std::ofstream::ofstream(&group,tagfile._M_dataplus._M_p,_S_out);
        if ((abStack_1d70[*(long *)(group._M_dataplus._M_p + -0x18)] & 5) == 0) {
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&group,tag._M_dataplus._M_p,tag._M_string_length);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          GetTestModelString_abi_cxx11_(&model,this);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&group,model._M_dataplus._M_p,model._M_string_length);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)model._M_dataplus._M_p != paVar15) {
            operator_delete(model._M_dataplus._M_p,
                            CONCAT71(model.field_2._M_allocated_capacity._1_7_,
                                     model.field_2._M_local_buf[0]) + 1);
          }
          uVar13 = (ulong)(uint)((this->Impl)._M_t.
                                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                 .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                                TestModel;
          if (uVar13 < 3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&group,&DAT_007daf00 + *(int *)(&DAT_007daf00 + uVar13 * 4),
                       *(long *)(&DAT_007daf10 + uVar13 * 8));
            std::endl<char,std::char_traits<char>>((ostream *)&group);
          }
        }
        std::ofstream::close();
        if (command == (cmCTestStartCommand *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&model);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&model,"Create new tag: ",0x10);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&model,tag._M_dataplus._M_p,tag._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," - ",3);
          GetTestModelString_abi_cxx11_((string *)&mon,this);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)CONCAT44(uStack_1e2c,mon),local_1e28);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_1e2c,mon) != &local_1e20) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_1e2c,mon),local_1e20._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          Log(this,1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x23c,(char *)CONCAT44(uStack_1e2c,mon),suppress);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_1e2c,mon) != &local_1e20) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_1e2c,mon),local_1e20._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&model);
          std::ios_base::~ios_base(local_1b20);
        }
        group._M_dataplus._M_p = _VTT;
        *(undefined8 *)(abStack_1d70 + *(long *)(_VTT + -0x18) + -0x20) = _EVP_PKEY_get_bn_param;
        std::filebuf::~filebuf((filebuf *)&group._M_string_length);
        std::ios_base::~ios_base(local_1c98);
      }
LAB_00527590:
      std::__cxx11::string::_M_assign
                ((string *)
                 &((this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->CurrentTag);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tag._M_dataplus._M_p != &tag.field_2) {
        operator_delete(tag._M_dataplus._M_p,
                        CONCAT71(tag.field_2._M_allocated_capacity._1_7_,tag.field_2._M_local_buf[0]
                                ) + 1);
      }
      std::ifstream::~ifstream(&tfin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tagfile._M_dataplus._M_p != &tagfile.field_2) {
        operator_delete(tagfile._M_dataplus._M_p,tagfile.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)testingDir._M_dataplus._M_p != &testingDir.field_2) {
        operator_delete(testingDir._M_dataplus._M_p,testingDir.field_2._M_allocated_capacity + 1);
      }
      goto LAB_005265ce;
    }
    paVar15 = &model.field_2;
    model._M_dataplus._M_p = (pointer)paVar15;
    model._M_string_length = 0;
    model.field_2._M_local_buf[0] = '\0';
    _year = (pointer)local_1a08;
    local_1a10 = 0;
    local_1a08[0]._M_local_buf[0] = '\0';
    if ((abStack_1988[*(long *)(_tfin + -0x18)] & 5) == 0) {
      cmsys::SystemTools::GetLineFromStream((istream *)&tfin,&tag,(bool *)0x0,0xffffffffffffffff);
      cmsys::SystemTools::GetLineFromStream((istream *)&tfin,&model,(bool *)0x0,0xffffffffffffffff);
      bVar6 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&tfin,(string *)&year,(bool *)0x0,0xffffffffffffffff);
      iVar7 = -1;
      if (bVar6) {
        iVar7 = GetTestModelFromString((string *)&year);
      }
      std::ifstream::close();
      if (tag._M_string_length == 0) goto LAB_00527059;
      _Var16._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      iVar8 = (_Var16._M_head_impl)->TestModel;
      if ((_Var16._M_head_impl)->TestModel != -1) {
LAB_00527281:
        if (iVar7 != -1 && iVar7 != iVar8) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&group,
                     "Model given in TAG does not match model given in ctest_start()",0x3e);
          std::endl<char,std::char_traits<char>>((ostream *)&group);
          std::__cxx11::stringbuf::str();
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x266,(char *)CONCAT44(uStack_1e2c,mon),suppress);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_1e2c,mon) != &local_1e20) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_1e2c,mon),local_1e20._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
          std::ios_base::~ios_base(local_1d20);
          _Var16._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        }
        __n = ((_Var16._M_head_impl)->SpecificGroup)._M_string_length;
        if ((__n == 0) ||
           ((model._M_string_length == __n &&
            (iVar7 = bcmp(model._M_dataplus._M_p,
                          ((_Var16._M_head_impl)->SpecificGroup)._M_dataplus._M_p,__n), iVar7 == 0))
           )) {
          std::__cxx11::string::_M_assign((string *)&(_Var16._M_head_impl)->SpecificGroup);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&group,
                     "Group given in TAG does not match group given in ctest_start()",0x3e);
          std::endl<char,std::char_traits<char>>((ostream *)&group);
          std::__cxx11::stringbuf::str();
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x26f,(char *)CONCAT44(uStack_1e2c,mon),suppress);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_1e2c,mon) != &local_1e20) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_1e2c,mon),local_1e20._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
          std::ios_base::~ios_base(local_1d20);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&group,"  Use existing tag: ",0x14);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&group,tag._M_dataplus._M_p,tag._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," - ",3);
        GetTestModelString_abi_cxx11_((string *)&mon,this);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(char *)CONCAT44(uStack_1e2c,mon),local_1e28);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_1e2c,mon) != &local_1e20) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_1e2c,mon),local_1e20._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        Log(this,1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x278,(char *)CONCAT44(uStack_1e2c,mon),suppress);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_1e2c,mon) != &local_1e20) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_1e2c,mon),local_1e20._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
        std::ios_base::~ios_base(local_1d20);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_year != local_1a08) {
          operator_delete(_year,CONCAT71(local_1a08[0]._M_allocated_capacity._1_7_,
                                         local_1a08[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)model._M_dataplus._M_p != paVar15) {
          operator_delete(model._M_dataplus._M_p,
                          CONCAT71(model.field_2._M_allocated_capacity._1_7_,
                                   model.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_00527590;
      }
      if (iVar7 != -1) {
        (_Var16._M_head_impl)->InteractiveDebugMode = false;
        (_Var16._M_head_impl)->TestModel = iVar7;
        iVar8 = iVar7;
        goto LAB_00527281;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&group,
                 "TAG file does not contain model and no model specified in start command",0x47);
      std::endl<char,std::char_traits<char>>((ostream *)&group);
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x259,(char *)CONCAT44(uStack_1e2c,mon),false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_1e2c,mon) != &local_1e20) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_1e2c,mon),local_1e20._M_allocated_capacity + 1);
      }
    }
    else {
LAB_00527059:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&group,"Cannot read existing TAG file in ",0x21);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&group,testingDir._M_dataplus._M_p,testingDir._M_string_length
                          );
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x250,(char *)CONCAT44(uStack_1e2c,mon),false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_1e2c,mon) != &local_1e20) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_1e2c,mon),local_1e20._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
    std::ios_base::~ios_base(local_1d20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_year != local_1a08) {
      operator_delete(_year,CONCAT71(local_1a08[0]._M_allocated_capacity._1_7_,
                                     local_1a08[0]._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)model._M_dataplus._M_p != paVar15) {
      operator_delete(model._M_dataplus._M_p,
                      CONCAT71(model.field_2._M_allocated_capacity._1_7_,
                               model.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tag._M_dataplus._M_p != &tag.field_2) {
      operator_delete(tag._M_dataplus._M_p,
                      CONCAT71(tag.field_2._M_allocated_capacity._1_7_,tag.field_2._M_local_buf[0])
                      + 1);
    }
    std::ifstream::~ifstream(&tfin);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tagfile._M_dataplus._M_p != &tagfile.field_2) {
      operator_delete(tagfile._M_dataplus._M_p,tagfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)testingDir._M_dataplus._M_p != &testingDir.field_2) goto LAB_005265be;
  }
  else {
    SVar11 = cmsys::SystemTools::MakeDirectory(&testingDir,(mode_t *)0x0);
    if (SVar11.Kind_ == Success) goto LAB_0052660a;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tfin);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&tfin,"Cannot create directory ",0x18);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&tfin,testingDir._M_dataplus._M_p,testingDir._M_string_length);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1e6,group._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)group._M_dataplus._M_p != &group.field_2) {
      operator_delete(group._M_dataplus._M_p,
                      CONCAT71(group.field_2._M_allocated_capacity._1_7_,
                               group.field_2._M_local_buf[0]) + 1);
    }
LAB_00526593:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tfin);
    std::ios_base::~ios_base(local_1938);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)testingDir._M_dataplus._M_p != &testingDir.field_2) {
LAB_005265be:
      operator_delete(testingDir._M_dataplus._M_p,testingDir.field_2._M_allocated_capacity + 1);
    }
  }
  iVar17 = 0;
LAB_005265ce:
  cmMakefile::~cmMakefile(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&gg);
  cmake::~cmake(&cm);
  return iVar17;
}

Assistant:

int cmCTest::Initialize(const char* binary_dir, cmCTestStartCommand* command)
{
  bool quiet = false;
  if (command && command->ShouldBeQuiet()) {
    quiet = true;
  }

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (!this->Impl->InteractiveDebugMode) {
    this->BlockTestErrorDiagnostics();
  } else {
    cmSystemTools::PutEnv("CTEST_INTERACTIVE_DEBUG_MODE=1");
  }

  this->Impl->BinaryDir = binary_dir;
  cmSystemTools::ConvertToUnixSlashes(this->Impl->BinaryDir);

  this->UpdateCTestConfiguration();

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (this->Impl->ProduceXML) {
    cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
    cmCTestOptionalLog(this, OUTPUT,
                       "   Site: "
                         << this->GetCTestConfiguration("Site") << std::endl
                         << "   Build name: "
                         << cmCTest::SafeBuildIdField(
                              this->GetCTestConfiguration("BuildName"))
                         << std::endl,
                       quiet);
    cmCTestOptionalLog(this, DEBUG, "Produce XML is on" << std::endl, quiet);
    if (this->Impl->TestModel == cmCTest::NIGHTLY &&
        this->GetCTestConfiguration("NightlyStartTime").empty()) {
      cmCTestOptionalLog(
        this, WARNING,
        "WARNING: No nightly start time found please set in CTestConfig.cmake"
        " or DartConfig.cmake"
          << std::endl,
        quiet);
      cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl,
                         quiet);
      return 0;
    }
  }

  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!this->ReadCustomConfigurationFileTree(this->Impl->BinaryDir, &mf)) {
    cmCTestOptionalLog(
      this, DEBUG, "Cannot find custom configuration file tree" << std::endl,
      quiet);
    return 0;
  }

  if (this->Impl->ProduceXML) {
    // Verify "Testing" directory exists:
    //
    std::string testingDir = this->Impl->BinaryDir + "/Testing";
    if (cmSystemTools::FileExists(testingDir)) {
      if (!cmSystemTools::FileIsDirectory(testingDir)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "File " << testingDir
                           << " is in the place of the testing directory"
                           << std::endl);
        return 0;
      }
    } else {
      if (!cmSystemTools::MakeDirectory(testingDir)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Cannot create directory " << testingDir << std::endl);
        return 0;
      }
    }

    // Create new "TAG" file or read existing one:
    //
    bool createNewTag = true;
    if (command) {
      createNewTag = command->ShouldCreateNewTag();
    }

    std::string tagfile = testingDir + "/TAG";
    cmsys::ifstream tfin(tagfile.c_str());
    std::string tag;

    if (createNewTag) {
      time_t tctime = time(nullptr);
      if (this->Impl->TomorrowTag) {
        tctime += (24 * 60 * 60);
      }
      struct tm* lctime = gmtime(&tctime);
      if (tfin && cmSystemTools::GetLineFromStream(tfin, tag)) {
        int year = 0;
        int mon = 0;
        int day = 0;
        int hour = 0;
        int min = 0;
        sscanf(tag.c_str(), "%04d%02d%02d-%02d%02d", &year, &mon, &day, &hour,
               &min);
        if (year != lctime->tm_year + 1900 || mon != lctime->tm_mon + 1 ||
            day != lctime->tm_mday) {
          tag.clear();
        }
        std::string group;
        if (cmSystemTools::GetLineFromStream(tfin, group) &&
            !this->Impl->Parts[PartStart] && !command) {
          this->Impl->SpecificGroup = group;
        }
        std::string model;
        if (cmSystemTools::GetLineFromStream(tfin, model) &&
            !this->Impl->Parts[PartStart] && !command) {
          this->Impl->TestModel = GetTestModelFromString(model);
        }
        tfin.close();
      }
      if (tag.empty() || (nullptr != command) ||
          this->Impl->Parts[PartStart]) {
        cmCTestOptionalLog(
          this, DEBUG,
          "TestModel: " << this->GetTestModelString() << std::endl, quiet);
        cmCTestOptionalLog(this, DEBUG,
                           "TestModel: " << this->Impl->TestModel << std::endl,
                           quiet);
        if (this->Impl->TestModel == cmCTest::NIGHTLY) {
          lctime = this->GetNightlyTime(
            this->GetCTestConfiguration("NightlyStartTime"),
            this->Impl->TomorrowTag);
        }
        char datestring[100];
        snprintf(datestring, sizeof(datestring), "%04d%02d%02d-%02d%02d",
                 lctime->tm_year + 1900, lctime->tm_mon + 1, lctime->tm_mday,
                 lctime->tm_hour, lctime->tm_min);
        tag = datestring;
        cmsys::ofstream ofs(tagfile.c_str());
        if (ofs) {
          ofs << tag << std::endl;
          ofs << this->GetTestModelString() << std::endl;
          switch (this->Impl->TestModel) {
            case cmCTest::EXPERIMENTAL:
              ofs << "Experimental" << std::endl;
              break;
            case cmCTest::NIGHTLY:
              ofs << "Nightly" << std::endl;
              break;
            case cmCTest::CONTINUOUS:
              ofs << "Continuous" << std::endl;
              break;
          }
        }
        ofs.close();
        if (nullptr == command) {
          cmCTestOptionalLog(this, OUTPUT,
                             "Create new tag: " << tag << " - "
                                                << this->GetTestModelString()
                                                << std::endl,
                             quiet);
        }
      }
    } else {
      std::string group;
      std::string modelStr;
      int model = cmCTest::UNKNOWN;

      if (tfin) {
        cmSystemTools::GetLineFromStream(tfin, tag);
        cmSystemTools::GetLineFromStream(tfin, group);
        if (cmSystemTools::GetLineFromStream(tfin, modelStr)) {
          model = GetTestModelFromString(modelStr);
        }
        tfin.close();
      }

      if (tag.empty()) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Cannot read existing TAG file in " << testingDir
                                                       << std::endl);
        return 0;
      }

      if (this->Impl->TestModel == cmCTest::UNKNOWN) {
        if (model == cmCTest::UNKNOWN) {
          cmCTestLog(this, ERROR_MESSAGE,
                     "TAG file does not contain model and "
                     "no model specified in start command"
                       << std::endl);
          return 0;
        }

        this->SetTestModel(model);
      }

      if (model != this->Impl->TestModel && model != cmCTest::UNKNOWN &&
          this->Impl->TestModel != cmCTest::UNKNOWN) {
        cmCTestOptionalLog(this, WARNING,
                           "Model given in TAG does not match "
                           "model given in ctest_start()"
                             << std::endl,
                           quiet);
      }

      if (!this->Impl->SpecificGroup.empty() &&
          group != this->Impl->SpecificGroup) {
        cmCTestOptionalLog(this, WARNING,
                           "Group given in TAG does not match "
                           "group given in ctest_start()"
                             << std::endl,
                           quiet);
      } else {
        this->Impl->SpecificGroup = group;
      }

      cmCTestOptionalLog(this, OUTPUT,
                         "  Use existing tag: " << tag << " - "
                                                << this->GetTestModelString()
                                                << std::endl,
                         quiet);
    }

    this->Impl->CurrentTag = tag;
  }

  return 1;
}